

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void checkList(IntegrityCk *pCheck,int isFreeList,Pgno iPage,u32 N)

{
  u32 uVar1;
  int iVar2;
  u8 *p;
  int iVar3;
  u32 uVar4;
  BtShared *pBVar5;
  char *pcVar6;
  u8 *p_00;
  u32 uVar7;
  ulong uVar8;
  bool bVar9;
  DbPage *pOvflPage;
  
  iVar2 = pCheck->nErr;
  uVar7 = N;
  while( true ) {
    if (((iPage == 0) || (pCheck->mxErr == 0)) || (iVar3 = checkRef(pCheck,iPage), iVar3 != 0))
    goto LAB_00178b00;
    uVar1 = uVar7 - 1;
    iVar3 = (*pCheck->pPager->xGet)(pCheck->pPager,iPage,&pOvflPage,0);
    if (iVar3 != 0) break;
    p = (u8 *)pOvflPage->pData;
    if (isFreeList == 0) {
      uVar7 = uVar1;
      if ((pCheck->pBt->autoVacuum != '\0') && (uVar1 != 0)) {
        uVar7 = sqlite3Get4byte(p);
        checkPtrmap(pCheck,uVar7,'\x04',iPage);
        uVar7 = uVar1;
      }
    }
    else {
      uVar4 = sqlite3Get4byte(p + 4);
      pBVar5 = pCheck->pBt;
      if (pBVar5->autoVacuum != '\0') {
        checkPtrmap(pCheck,iPage,'\x02',0);
        pBVar5 = pCheck->pBt;
      }
      if ((pBVar5->usableSize >> 2) - 2 < uVar4) {
        checkAppendMsg(pCheck,"freelist leaf count too big on page %d",(ulong)iPage);
        uVar7 = uVar7 - 2;
      }
      else {
        p_00 = p + 8;
        uVar8 = 0;
        if (0 < (int)uVar4) {
          uVar8 = (ulong)uVar4;
        }
        while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
          uVar7 = sqlite3Get4byte(p_00);
          if (pCheck->pBt->autoVacuum != '\0') {
            checkPtrmap(pCheck,uVar7,'\x02',0);
          }
          checkRef(pCheck,uVar7);
          p_00 = p_00 + 4;
        }
        uVar7 = uVar1 - uVar4;
      }
    }
    iPage = sqlite3Get4byte(p);
    sqlite3PagerUnref(pOvflPage);
  }
  checkAppendMsg(pCheck,"failed to get page %d",(ulong)iPage);
  uVar7 = uVar1;
LAB_00178b00:
  if ((uVar7 != 0) && (iVar2 == pCheck->nErr)) {
    pcVar6 = "size";
    if (isFreeList == 0) {
      pcVar6 = "overflow list length";
    }
    checkAppendMsg(pCheck,"%s is %d but should be %d",pcVar6,(ulong)(N - uVar7));
  }
  return;
}

Assistant:

static void checkList(
  IntegrityCk *pCheck,  /* Integrity checking context */
  int isFreeList,       /* True for a freelist.  False for overflow page list */
  Pgno iPage,           /* Page number for first page in the list */
  u32 N                 /* Expected number of pages in the list */
){
  int i;
  u32 expected = N;
  int nErrAtStart = pCheck->nErr;
  while( iPage!=0 && pCheck->mxErr ){
    DbPage *pOvflPage;
    unsigned char *pOvflData;
    if( checkRef(pCheck, iPage) ) break;
    N--;
    if( sqlite3PagerGet(pCheck->pPager, (Pgno)iPage, &pOvflPage, 0) ){
      checkAppendMsg(pCheck, "failed to get page %d", iPage);
      break;
    }
    pOvflData = (unsigned char *)sqlite3PagerGetData(pOvflPage);
    if( isFreeList ){
      u32 n = (u32)get4byte(&pOvflData[4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pCheck->pBt->autoVacuum ){
        checkPtrmap(pCheck, iPage, PTRMAP_FREEPAGE, 0);
      }
#endif
      if( n>pCheck->pBt->usableSize/4-2 ){
        checkAppendMsg(pCheck,
           "freelist leaf count too big on page %d", iPage);
        N--;
      }else{
        for(i=0; i<(int)n; i++){
          Pgno iFreePage = get4byte(&pOvflData[8+i*4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
          if( pCheck->pBt->autoVacuum ){
            checkPtrmap(pCheck, iFreePage, PTRMAP_FREEPAGE, 0);
          }
#endif
          checkRef(pCheck, iFreePage);
        }
        N -= n;
      }
    }
#ifndef SQLITE_OMIT_AUTOVACUUM
    else{
      /* If this database supports auto-vacuum and iPage is not the last
      ** page in this overflow list, check that the pointer-map entry for
      ** the following page matches iPage.
      */
      if( pCheck->pBt->autoVacuum && N>0 ){
        i = get4byte(pOvflData);
        checkPtrmap(pCheck, i, PTRMAP_OVERFLOW2, iPage);
      }
    }
#endif
    iPage = get4byte(pOvflData);
    sqlite3PagerUnref(pOvflPage);
  }
  if( N && nErrAtStart==pCheck->nErr ){
    checkAppendMsg(pCheck,
      "%s is %d but should be %d",
      isFreeList ? "size" : "overflow list length",
      expected-N, expected);
  }
}